

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnu_gettext.h
# Opt level: O3

void __thiscall booster::locale::gnu_gettext::messages_info::~messages_info(messages_info *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  
  p_Var1 = (this->callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->paths);
  std::
  vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ::~vector(&this->domains);
  pcVar2 = (this->locale_category)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->locale_category).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->encoding)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->encoding).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->variant)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->variant).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->country)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->country).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->language)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->language).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

messages_info() :
            language("C"),
            locale_category("LC_MESSAGES")
        {
        }